

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_uint_base.cpp
# Opt level: O2

void __thiscall sc_dt::sc_uint_subref::concat_set(sc_uint_subref *this,sc_signed *src,int low_i)

{
  bool bVar1;
  sc_uint_base aa;
  sc_signed local_40;
  
  sc_uint_base::sc_uint_base
            (&aa,((this->super_sc_uint_subref_r).m_left - (this->super_sc_uint_subref_r).m_right) +
                 1);
  if (low_i < src->nbits) {
    sc_dt::operator>>(&local_40,src,low_i);
    sc_uint_base::operator=(&aa,&local_40);
    operator=(this,&aa);
    sc_signed::~sc_signed(&local_40);
  }
  else {
    bVar1 = sc_dt::operator<(src,0);
    aa.m_val = 0xffffffffffffffff >> ((byte)aa.m_ulen & 0x3f);
    if (!bVar1) {
      aa.m_val = 0;
    }
    operator=(this,aa.m_val);
  }
  return;
}

Assistant:

void sc_uint_subref::concat_set(const sc_signed& src, int low_i)
{
    sc_uint_base aa( length() );
    if ( low_i < src.length() )
        *this = aa = src >> low_i;
    else
        *this = aa = (src < 0) ? (int_type)-1 : 0;
}